

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void flush_and_trigger(EVclient client,int reconfig)

{
  event_path_data evp;
  int iVar1;
  int *data;
  void *pvVar2;
  stone_type p_Var3;
  undefined8 uVar4;
  long lVar5;
  int stone_num;
  int iVar6;
  long lVar7;
  CMFormat flush_msg;
  
  evp = client->cm->evp;
  data = (int *)INT_CMmalloc(0x18);
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  pvVar2 = INT_CMmalloc(0x10);
  *(void **)(data + 4) = pvVar2;
  iVar6 = 0;
  iVar1 = evp->stone_base_num;
  for (stone_num = iVar1; stone_num < iVar1 + evp->stone_count; stone_num = stone_num + 1) {
    p_Var3 = stone_struct(evp,stone_num);
    if (p_Var3->stone_attrs != (attr_list)0x0) {
      iVar1 = lookup_global_stone(evp,p_Var3->local_id);
      lVar5 = (long)iVar6 * 0x10;
      *(long *)(*(long *)(data + 4) + lVar5) = (long)iVar1;
      uVar4 = attr_list_to_string(p_Var3->stone_attrs);
      pvVar2 = *(void **)(data + 4);
      *(undefined8 *)((long)pvVar2 + lVar5 + 8) = uVar4;
      iVar6 = iVar6 + 1;
      pvVar2 = INT_CMrealloc(pvVar2,lVar5 + 0x20);
      *(void **)(data + 4) = pvVar2;
    }
    iVar1 = evp->stone_base_num;
  }
  *(long *)(data + 2) = (long)iVar6;
  flush_msg = INT_CMlookup_format(client->cm,EVdfg_flush_attrs_reconfig_format_list);
  *data = reconfig;
  if (client->master_connection != (CMConnection)0x0) {
    INT_CMwrite(client->master_connection,flush_msg,data);
    lVar5 = 8;
    for (lVar7 = 0; lVar7 < *(long *)(data + 2); lVar7 = lVar7 + 1) {
      free(*(void **)((long)*(void **)(data + 4) + lVar5));
      lVar5 = lVar5 + 0x10;
    }
    free(*(void **)(data + 4));
    free(data);
    return;
  }
  queue_master_msg(client->master,&flush_msg,DFGflush_reconfig,(CMConnection)0x0,0);
  return;
}

Assistant:

static void
flush_and_trigger(EVclient client, int reconfig)
{
    EVflush_attrs_reconfig_ptr msg = build_attrs_msg(client);
    CMFormat flush_msg = INT_CMlookup_format(client->cm, EVdfg_flush_attrs_reconfig_format_list);
    msg->reconfig = reconfig;
    if (client->master_connection != NULL) {
	/* we are a client, send the reconfig to the master */
	INT_CMwrite(client->master_connection, flush_msg, msg);
	free_attrs_msg(msg);
    } else {
	queue_master_msg(client->master, &flush_msg, DFGflush_reconfig, NULL, /*copy*/ 0);
    }
}